

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

void Node_RemoveNotify(node *Node,dataid Id,notifyproc Func,void *Referer)

{
  long lVar1;
  long *plVar2;
  long *in_RAX;
  long *plVar3;
  long *plVar4;
  long **pplVar5;
  nodenotify *Top;
  long *local_38;
  
  if (Node != (node *)0x0) {
    lVar1 = *Node->VMT;
    local_38 = in_RAX;
    plVar3 = (long *)Node_GetData(Node,Id,0xe);
    if (plVar3 != (long *)0x0) {
      plVar2 = (long *)plVar3[2];
      pplVar5 = &local_38;
      for (plVar4 = (long *)*plVar3; plVar4 != (long *)0x0; plVar4 = (long *)*plVar4) {
        if (((notifyproc)plVar4[1] == Func) && ((void *)plVar4[2] == Referer)) {
          local_38 = plVar4;
          if (*pplVar5 == (long *)*plVar3) {
            *plVar3 = *plVar4;
            plVar4 = plVar2;
          }
          else {
            *pplVar5 = (long *)*plVar4;
            plVar4 = (long *)plVar3[2];
          }
          if (plVar4 == local_38) {
            plVar3[2] = 0;
          }
          else {
            lVar1 = *(long *)(lVar1 + 0x80);
            (**(code **)(lVar1 + 8))(lVar1,local_38,0x18);
          }
          break;
        }
        pplVar5 = (long **)plVar4;
      }
      if ((*plVar3 == 0) && (plVar2 == (long *)plVar3[2])) {
        Node_RemoveData(Node,Id,0xe);
      }
    }
  }
  return;
}

Assistant:

void Node_RemoveNotify(node* Node, dataid Id, notifyproc Func, void* Referer)
{
    if (Node)
    {
        nodecontext* p = Node_Context(Node);
        nodenotify* n;

        n = Node_GetData(Node,Id,TYPE_NODENOTIFY);
        if (n)
        {
            nodenotify** Ptr;
            nodenotify* Top = n;
            void *OldReferer = Top->Referer;

            n = Top->Next; // skip the first element which is just there to know if an item of the chain is being notified
            Ptr = &n;
            for (;(n=*Ptr)!=NULL;Ptr=&n->Next)
            {
                if (n->Func==Func && n->Referer==Referer)
                {
                    // remove the item from the list
                    if (*Ptr == Top->Next)
                        Top->Next = n->Next;
                    else
                        *Ptr = n->Next;

                    if (Top->Referer==n) // this notification item is being called
                        Top->Referer = NULL; // tell the notifier that it should remove this element after the call
                    else
                        MemHeap_Free(p->NodeHeap,n,sizeof(nodenotify));
                    break;
                }
            }

            if (Top->Next==NULL && OldReferer==Top->Referer)
                Node_RemoveData(Node,Id,TYPE_NODENOTIFY); // the notification list is empty and it's not being called
        }
    }
}